

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_schema_entry.cpp
# Opt level: O2

optional_ptr<duckdb::CatalogEntry,_true> __thiscall
duckdb::DuckSchemaEntry::CreateTable
          (DuckSchemaEntry *this,CatalogTransaction transaction,BoundCreateTableInfo *info)

{
  OnCreateConflict on_conflict;
  CatalogTransaction transaction_00;
  type table;
  reference this_00;
  type pAVar1;
  CatalogEntry *entry;
  create_info_set_t *pcVar2;
  pointer pDVar3;
  pointer pCVar4;
  optional_ptr<duckdb::CatalogEntry,_true> oVar5;
  idx_t i;
  ulong __n;
  __node_base *p_Var6;
  vector<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_true>
  fk_arrays;
  _Head_base<0UL,_duckdb::StandardEntry_*,_false> local_d8;
  _Head_base<0UL,_duckdb::DuckTableEntry_*,_false> local_d0;
  _Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_c8;
  BoundCreateTableInfo *local_c0;
  vector<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>_>_>
  local_b8;
  optional_ptr<duckdb::CatalogEntry,_true> local_a0;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  transaction_t local_78;
  _Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  local_c0 = info;
  make_uniq<duckdb::DuckTableEntry,duckdb::Catalog&,duckdb::DuckSchemaEntry&,duckdb::BoundCreateTableInfo&>
            ((duckdb *)&local_d0,(this->super_SchemaCatalogEntry).super_InCatalogEntry.catalog,this,
             info);
  local_b8.
  super__Vector_base<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  table = unique_ptr<duckdb::DuckTableEntry,_std::default_delete<duckdb::DuckTableEntry>,_true>::
          operator*((unique_ptr<duckdb::DuckTableEntry,_std::default_delete<duckdb::DuckTableEntry>,_true>
                     *)&local_d0);
  FindForeignKeyInformation
            (&table->super_TableCatalogEntry,AFT_ADD,
             (vector<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_true>
              *)&local_b8);
  local_c8 = (_Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)&local_c0->dependencies;
  for (__n = 0; __n < (ulong)((long)local_b8.
                                    super__Vector_base<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_b8.
                                    super__Vector_base<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1)
  {
    this_00 = vector<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_true>
              ::get<true>((vector<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_true>
                           *)&local_b8,__n);
    pAVar1 = unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>
             ::operator*(this_00);
    (*(this->super_SchemaCatalogEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry
      [0x20])(this,pAVar1);
    local_a0 = CatalogSet::GetEntry
                         (&this->tables,transaction,
                          &(pAVar1->super_AlterTableInfo).super_AlterInfo.name);
    entry = optional_ptr<duckdb::CatalogEntry,_true>::operator*(&local_a0);
    LogicalDependencyList::AddDependency((LogicalDependencyList *)local_c8,entry);
  }
  pcVar2 = LogicalDependencyList::Set((LogicalDependencyList *)local_c8);
  p_Var6 = &(pcVar2->_M_h)._M_before_begin;
  while (local_d8._M_head_impl = (StandardEntry *)local_d0._M_head_impl, p_Var6 = p_Var6->_M_nxt,
        p_Var6 != (__node_base *)0x0) {
    pDVar3 = unique_ptr<duckdb::DuckTableEntry,_std::default_delete<duckdb::DuckTableEntry>,_true>::
             operator->((unique_ptr<duckdb::DuckTableEntry,_std::default_delete<duckdb::DuckTableEntry>,_true>
                         *)&local_d0);
    LogicalDependencyList::AddDependency
              (&(pDVar3->super_TableCatalogEntry).super_StandardEntry.dependencies,
               (LogicalDependency *)(p_Var6 + 1));
  }
  local_78 = transaction.start_time;
  local_98 = transaction.db.ptr._0_4_;
  uStack_94 = transaction.db.ptr._4_4_;
  uStack_90 = transaction.context.ptr._0_4_;
  uStack_8c = transaction.context.ptr._4_4_;
  local_88 = transaction.transaction.ptr._0_4_;
  uStack_84 = transaction.transaction.ptr._4_4_;
  uStack_80 = (undefined4)transaction.transaction_id;
  uStack_7c = transaction.transaction_id._4_4_;
  local_d0._M_head_impl = (DuckTableEntry *)0x0;
  pCVar4 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     (&local_c0->base);
  on_conflict = pCVar4->on_conflict;
  ::std::
  _Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable(&local_68,local_c8);
  transaction_00.db.ptr._4_4_ = uStack_94;
  transaction_00.db.ptr._0_4_ = local_98;
  transaction_00.context.ptr._0_4_ = uStack_90;
  transaction_00.context.ptr._4_4_ = uStack_8c;
  transaction_00.transaction.ptr._0_4_ = local_88;
  transaction_00.transaction.ptr._4_4_ = uStack_84;
  transaction_00.transaction_id._0_4_ = uStack_80;
  transaction_00.transaction_id._4_4_ = uStack_7c;
  transaction_00.start_time = local_78;
  oVar5 = AddEntryInternal(this,transaction_00,
                           (unique_ptr<duckdb::StandardEntry,_std::default_delete<duckdb::StandardEntry>,_true>
                            *)&local_d8,on_conflict,(LogicalDependencyList *)&local_68);
  ::std::
  _Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  if ((DuckTableEntry *)local_d8._M_head_impl != (DuckTableEntry *)0x0) {
    (*(((TableCatalogEntry *)&(local_d8._M_head_impl)->super_InCatalogEntry)->super_StandardEntry).
      super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry[1])();
  }
  local_d8._M_head_impl = (StandardEntry *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AlterForeignKeyInfo,_std::default_delete<duckdb::AlterForeignKeyInfo>,_true>_>_>
  ::~vector(&local_b8);
  if (local_d0._M_head_impl != (DuckTableEntry *)0x0) {
    (*((local_d0._M_head_impl)->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
      super_CatalogEntry._vptr_CatalogEntry[1])();
  }
  return (optional_ptr<duckdb::CatalogEntry,_true>)oVar5.ptr;
}

Assistant:

optional_ptr<CatalogEntry> DuckSchemaEntry::CreateTable(CatalogTransaction transaction, BoundCreateTableInfo &info) {
	auto table = make_uniq<DuckTableEntry>(catalog, *this, info);

	// add a foreign key constraint in main key table if there is a foreign key constraint
	vector<unique_ptr<AlterForeignKeyInfo>> fk_arrays;
	FindForeignKeyInformation(*table, AlterForeignKeyType::AFT_ADD, fk_arrays);
	for (idx_t i = 0; i < fk_arrays.size(); i++) {
		// alter primary key table
		auto &fk_info = *fk_arrays[i];
		Alter(transaction, fk_info);

		// make a dependency between this table and referenced table
		auto &set = GetCatalogSet(CatalogType::TABLE_ENTRY);
		info.dependencies.AddDependency(*set.GetEntry(transaction, fk_info.name));
	}
	for (auto &dep : info.dependencies.Set()) {
		table->dependencies.AddDependency(dep);
	}

	auto entry = AddEntryInternal(transaction, std::move(table), info.Base().on_conflict, info.dependencies);
	if (!entry) {
		return nullptr;
	}

	return entry;
}